

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::EagerPromiseNodeBase::tracePromise
          (EagerPromiseNodeBase *this,TraceBuilder *builder,bool stopAtNextEvent)

{
  PromiseNode *pPVar1;
  bool stopAtNextEvent_local;
  TraceBuilder *builder_local;
  EagerPromiseNodeBase *this_local;
  
  if ((!stopAtNextEvent) &&
     (pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::get(&this->dependency),
     pPVar1 != (PromiseNode *)0x0)) {
    pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->dependency);
    (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])
              (pPVar1,builder,(ulong)stopAtNextEvent);
  }
  return;
}

Assistant:

void EagerPromiseNodeBase::tracePromise(TraceBuilder& builder, bool stopAtNextEvent) {
  // TODO(debug): Maybe use __builtin_return_address to get the locations that called
  //   eagerlyEvaluate()? But note that if a non-null exception handler was passed to it, that
  //   creates a TransformPromiseNode which will report the location anyhow.

  if (stopAtNextEvent) return;
  if (dependency.get() != nullptr) {
    dependency->tracePromise(builder, stopAtNextEvent);
  }
}